

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_jordan.cpp
# Opt level: O3

void opengv::math::gauss_jordan
               (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                *matrix,int exitCondition)

{
  long *plVar1;
  undefined1 (*pauVar2) [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer ppvVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int col;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int col_1;
  vector<int,_std::allocator<int>_> nonzeroIdx;
  int local_7c;
  void *local_78;
  iterator iStack_70;
  int *local_68;
  long local_58;
  int local_4c;
  ulong local_48;
  long local_40;
  long local_38;
  
  ppvVar5 = (matrix->
            super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = *ppvVar5;
  uVar24 = (ulong)((long)*(pointer *)
                          ((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data + 8) -
                  *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data) >> 3;
  uVar16 = (uint)((ulong)((long)(matrix->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar5) >> 3);
  iVar23 = (int)uVar24;
  local_4c = exitCondition;
  if ((int)uVar16 < 1) {
    uVar24 = 0xffffffff;
  }
  else {
    local_38 = (long)iVar23;
    uVar25 = (ulong)(uVar16 & 0x7fffffff);
    uVar16 = iVar23 - 2;
    lVar27 = 0;
    local_40 = uVar24 + 0xfffffffe;
    local_48 = 1;
    uVar19 = 0;
    do {
      uVar24 = uVar19;
      auVar28 = ZEXT816(0xbff0000000000000);
      auVar42._8_8_ = 0x7fffffffffffffff;
      auVar42._0_8_ = 0x7fffffffffffffff;
      ppvVar5 = (matrix->
                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_58 = CONCAT44(local_58._4_4_,uVar16);
      uVar18 = 0xffffffff;
      lVar27 = (lVar27 << 0x1d) >> 0x1d;
      uVar19 = uVar24;
      do {
        auVar39._8_8_ = 0;
        auVar39._0_8_ =
             *(ulong *)(*(long *)&(ppvVar5[uVar19]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + uVar24 * 8);
        auVar39 = vandpd_avx(auVar39,auVar42);
        dVar34 = auVar28._0_8_;
        auVar28 = vmaxsd_avx(auVar39,auVar28);
        if (dVar34 < auVar39._0_8_) {
          uVar18 = uVar19 & 0xffffffff;
        }
        uVar19 = uVar19 + 1;
      } while (uVar25 != uVar19);
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pvVar6 = ppvVar5[(int)uVar18];
      ppvVar5[(int)uVar18] = ppvVar5[uVar24];
      ppvVar5[uVar24] = pvVar6;
      lVar26 = *(long *)&((matrix->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar24]->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data;
      dVar34 = *(double *)(lVar26 + uVar24 * 8);
      *(undefined8 *)(lVar26 + uVar24 * 8) = 0x3ff0000000000000;
      iVar15 = (int)uVar24;
      if (iVar15 + 1 < iVar23) {
        auVar28._0_8_ = 1.0 / dVar34;
        auVar28._8_8_ = 0;
        auVar30 = vpbroadcastq_avx512f();
        lVar26 = lVar26 + 8 + lVar27;
        lVar17 = 0;
        auVar31 = vbroadcastsd_avx512f(auVar28);
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar19 = vpcmpuq_avx512f(auVar32,auVar30,2);
          plVar1 = (long *)(lVar26 + lVar17 * 8);
          auVar32._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * plVar1[1];
          auVar32._0_8_ = (ulong)((byte)uVar19 & 1) * *plVar1;
          auVar32._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * plVar1[2];
          auVar32._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * plVar1[3];
          auVar32._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * plVar1[4];
          auVar32._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * plVar1[5];
          auVar32._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * plVar1[6];
          auVar32._56_8_ = (uVar19 >> 7) * plVar1[7];
          auVar32 = vmulpd_avx512f(auVar31,auVar32);
          pauVar2 = (undefined1 (*) [64])(lVar26 + lVar17 * 8);
          bVar8 = (bool)((byte)uVar19 & 1);
          auVar33._0_8_ = (ulong)bVar8 * auVar32._0_8_ | (ulong)!bVar8 * *(long *)*pauVar2;
          bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar33._8_8_ = (ulong)bVar8 * auVar32._8_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 8);
          bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar33._16_8_ =
               (ulong)bVar8 * auVar32._16_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 0x10);
          bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar33._24_8_ =
               (ulong)bVar8 * auVar32._24_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 0x18);
          bVar8 = (bool)((byte)(uVar19 >> 4) & 1);
          auVar33._32_8_ =
               (ulong)bVar8 * auVar32._32_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 0x20);
          bVar8 = (bool)((byte)(uVar19 >> 5) & 1);
          auVar33._40_8_ =
               (ulong)bVar8 * auVar32._40_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 0x28);
          bVar8 = (bool)((byte)(uVar19 >> 6) & 1);
          auVar33._48_8_ =
               (ulong)bVar8 * auVar32._48_8_ | (ulong)!bVar8 * *(long *)(*pauVar2 + 0x30);
          auVar33._56_8_ =
               (uVar19 >> 7) * auVar32._56_8_ |
               (ulong)!SUB81(uVar19 >> 7,0) * *(long *)(*pauVar2 + 0x38);
          *pauVar2 = auVar33;
          lVar17 = lVar17 + 8;
        } while (((ulong)uVar16 - (ulong)(uVar16 & 7)) + 8 != lVar17);
      }
      local_68 = (int *)0x0;
      local_78 = (void *)0x0;
      iStack_70._M_current = (int *)0x0;
      local_7c = iVar15;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_78,local_38 - uVar24);
      for (; local_7c < iVar23; local_7c = local_7c + 1) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             *(ulong *)(*(long *)&((matrix->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar24]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + (long)local_7c * 8);
        auVar9._8_8_ = 0x7fffffffffffffff;
        auVar9._0_8_ = 0x7fffffffffffffff;
        auVar28 = vandpd_avx512vl(auVar35,auVar9);
        if (1e-10 < auVar28._0_8_) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_7c);
          }
          else {
            *iStack_70._M_current = local_7c;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
      }
      uVar19 = uVar24 + 1;
      if (uVar19 < uVar25) {
        ppvVar5 = (matrix->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar16 = (uint)((ulong)((long)iStack_70._M_current - (long)local_78) >> 2);
        uVar18 = local_48;
        do {
          lVar26 = *(long *)&(ppvVar5[uVar18]->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(lVar26 + uVar24 * 8);
          auVar10._8_8_ = 0x7fffffffffffffff;
          auVar10._0_8_ = 0x7fffffffffffffff;
          auVar28 = vandpd_avx512vl(auVar36,auVar10);
          if ((1e-10 < auVar28._0_8_) && (0 < (int)uVar16)) {
            auVar11._8_8_ = 0x8000000000000000;
            auVar11._0_8_ = 0x8000000000000000;
            auVar28 = vxorpd_avx512vl(auVar36,auVar11);
            uVar20 = 0;
            lVar17 = *(long *)&(ppvVar5[uVar24]->super__Vector_base<double,_std::allocator<double>_>
                               )._M_impl.super__Vector_impl_data;
            do {
              lVar21 = (long)*(int *)((long)local_78 + uVar20 * 4);
              uVar20 = uVar20 + 1;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(lVar17 + lVar21 * 8);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(lVar26 + lVar21 * 8);
              auVar42 = vfmadd213sd_fma(auVar40,auVar28,auVar3);
              *(long *)(lVar26 + lVar21 * 8) = auVar42._0_8_;
            } while ((uVar16 & 0x7fffffff) != uVar20);
          }
          uVar18 = uVar18 + 1;
          local_7c = iVar15;
        } while (uVar18 != uVar25);
      }
      if (local_78 != (void *)0x0) {
        operator_delete(local_78);
      }
      local_48 = local_48 + 1;
      lVar27 = lVar27 + 8;
      uVar16 = (int)local_58 - 1;
    } while (uVar19 != uVar25);
  }
  if (local_4c < (int)uVar24) {
    lVar26 = (long)(int)uVar24;
    local_58 = (long)iVar23;
    lVar27 = (long)local_4c;
    do {
      local_7c = (int)lVar26;
      local_68 = (int *)0x0;
      local_78 = (void *)0x0;
      iStack_70._M_current = (int *)0x0;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_78,local_58 - lVar26);
      for (; local_7c < iVar23; local_7c = local_7c + 1) {
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             *(ulong *)(*(long *)&((matrix->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar26]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + (long)local_7c * 8);
        auVar12._8_8_ = 0x7fffffffffffffff;
        auVar12._0_8_ = 0x7fffffffffffffff;
        auVar28 = vandpd_avx512vl(auVar37,auVar12);
        if (1e-10 < auVar28._0_8_) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_7c);
          }
          else {
            *iStack_70._M_current = local_7c;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
      }
      ppvVar5 = (matrix->
                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (uint)((ulong)((long)iStack_70._M_current - (long)local_78) >> 2);
      lVar17 = lVar26;
      do {
        lVar21 = *(long *)&(ppvVar5[lVar17 + -1]->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(lVar21 + lVar26 * 8);
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar28 = vandpd_avx512vl(auVar38,auVar13);
        if ((1e-10 < auVar28._0_8_) && (0 < (int)uVar16)) {
          auVar14._8_8_ = 0x8000000000000000;
          auVar14._0_8_ = 0x8000000000000000;
          auVar28 = vxorpd_avx512vl(auVar38,auVar14);
          uVar24 = 0;
          lVar7 = *(long *)&(ppvVar5[lVar26]->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data;
          do {
            lVar22 = (long)*(int *)((long)local_78 + uVar24 * 4);
            uVar24 = uVar24 + 1;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)(lVar7 + lVar22 * 8);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(lVar21 + lVar22 * 8);
            auVar42 = vfmadd213sd_fma(auVar41,auVar28,auVar4);
            *(long *)(lVar21 + lVar22 * 8) = auVar42._0_8_;
          } while ((uVar16 & 0x7fffffff) != uVar24);
        }
        lVar17 = lVar17 + -1;
      } while (lVar27 < lVar17);
      if (local_78 != (void *)0x0) {
        operator_delete(local_78);
      }
      lVar26 = lVar26 + -1;
    } while (lVar27 < lVar26);
  }
  return;
}

Assistant:

void
opengv::math::gauss_jordan(
    std::vector<std::vector<double>*> & matrix, int exitCondition )
{  
  //create some constants for zero-checking etc.
  double precision = 1.0e-10;
  int rows = matrix.size();
  int cols = matrix[0]->size();
  
  //the working row
  int frontRow;
  
  //first step down
  for( frontRow = 0; frontRow < rows; frontRow++ )
  {
    // first iterate through the rows and find the row that has the biggest
    // leading coefficient
    double maxValue = -1.0;
    int row = -1;
    for( int tempRow = frontRow; tempRow < rows; tempRow++ )
    {
      double value = fabs((*(matrix[tempRow]))[frontRow]);
      if( value > maxValue )
      {
        row = tempRow;
        maxValue = value;
      }
    }
    
    //rowIter is now the row that should go in the place of frontRow->swap    
    std::swap( matrix[row], matrix[frontRow] );
    
    //ok, now use frontRow!
    
    //first divide all coefficients by the leading coefficient
    int col = frontRow;
    double leadingCoefficient_inv = 1.0 / (*(matrix[frontRow]))[col];
    (*(matrix[frontRow]))[col] = 1.0;
    ++col;
    while( col < cols )
    {
      (*(matrix[frontRow]))[col] *= leadingCoefficient_inv;
      ++col;
    }
    
    //create a vector of bools indicating the cols that need to be manipulated
    col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //iterate through all remaining rows, and subtract correct multiple of 
    //first row (if leading coefficient is non-zero!)
    row = frontRow;
    ++row;
    while( row < rows )
    {
      col = frontRow;
      double leadingCoefficient = (*(matrix[row]))[col];
      
      if( fabs(leadingCoefficient) > precision )
      {
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * ((*(matrix[frontRow]))[nonzeroIdx[col]]);
      }
      
      ++row;
    }
  }
  
  //set index to the last non-zero row
  --frontRow;
  
  //Now step up
  while( frontRow > exitCondition )
  {    
    //create a vector of bools indicating the cols that need to be manipulated
    int col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //get the working row
    int row = frontRow;
    
    do
    {      
      //decrement working row
      --row;
      
      //working column
      
      //now get the leading coefficient
      double leadingCoefficient = (*(matrix[row]))[frontRow];
      
      //Now iterator until the end, and subtract each time the multiplied
      //front-row
      if( fabs(leadingCoefficient) > precision )
      {        
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * (*(matrix[frontRow]))[nonzeroIdx[col]];
      }
    }
    while( row > exitCondition );
    
    --frontRow;
  }
}